

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O0

uint64_t __thiscall kaitai::kstream::read_u8be(kstream *this)

{
  __uint64_t _Var1;
  __uint64_t local_18;
  uint64_t t;
  kstream *this_local;
  
  t = (uint64_t)this;
  std::istream::read((char *)this->m_io,(long)&local_18);
  _Var1 = __bswap_64(local_18);
  return _Var1;
}

Assistant:

uint64_t kaitai::kstream::read_u8be() {
    uint64_t t;
    m_io->read(reinterpret_cast<char *>(&t), 8);
#if __BYTE_ORDER == __LITTLE_ENDIAN
    t = bswap_64(t);
#endif
    return t;
}